

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::TextTreeRenderer::RenderBoxContent
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  pointer pcVar1;
  pointer ppVar2;
  undefined8 uVar3;
  TextTreeRenderer *pTVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  reference pvVar8;
  size_t sVar9;
  iterator iVar10;
  long *plVar11;
  long *plVar12;
  RenderTreeNode *pRVar13;
  ulong x;
  RenderTreeNode *pRVar14;
  idx_t x_00;
  pointer ppVar15;
  ulong x_01;
  char *pcVar16;
  optional_ptr<duckdb::RenderTreeNode,_true> node_1;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  extra_info;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [32];
  TextTreeRenderer *local_c8;
  idx_t local_c0;
  ulong local_b8;
  ulong local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  idx_t local_88;
  ulong local_80;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  local_78;
  size_type local_60;
  ulong local_58;
  string local_50;
  
  local_78.
  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._8_8_ = ss;
  ::std::
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
  ::resize(&local_78,root->width);
  local_c8 = this;
  if (root->width == 0) {
    local_b0 = 0;
  }
  else {
    local_b0 = 0;
    x_00 = 0;
    do {
      local_e8._0_8_ = RenderTree::GetNode(root,x_00,y);
      if ((RenderTreeNode *)local_e8._0_8_ != (RenderTreeNode *)0x0) {
        optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                  ((optional_ptr<duckdb::RenderTreeNode,_true> *)local_e8);
        uVar3 = local_e8._0_8_;
        pvVar8 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                 ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                               *)&local_78,x_00);
        SplitUpExtraInfo(local_c8,(InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(uVar3 + 0x20),pvVar8,(local_c8->config).max_extra_lines);
        pvVar8 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                 ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                               *)&local_78,x_00);
        if (local_b0 <
            (ulong)((long)(pvVar8->
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar8->
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          pvVar8 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                   ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                                 *)&local_78,x_00);
          local_b0 = (long)(pvVar8->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar8->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
        }
      }
      x_00 = x_00 + 1;
    } while (x_00 < root->width);
  }
  local_80 = local_b0 + 1 >> 1;
  local_88 = y + 1;
  local_b8 = 0;
  local_c0 = y;
  do {
    if (root->width != 0) {
      local_60 = local_b8 - 1;
      local_58 = local_b8 + 1;
      x = 0;
      do {
        if ((local_c8->config).maximum_render_width <= (local_c8->config).node_render_width * x)
        break;
        if (x < root->width) {
          x_01 = x;
          bVar6 = false;
          do {
            bVar5 = true;
            if (bVar6 == false) {
              bVar5 = RenderTree::HasNode(root,x_01,y);
            }
            x_01 = x_01 + 1;
            bVar6 = bVar5;
          } while (x_01 < root->width);
        }
        else {
          bVar5 = false;
        }
        local_f8._M_allocated_capacity = (size_type)RenderTree::GetNode(root,x,y);
        if ((RenderTreeNode *)local_f8._M_allocated_capacity == (RenderTreeNode *)0x0) {
          if (local_b8 == local_80) {
            bVar6 = ShouldRenderWhitespace(root,x,y);
            bVar7 = RenderTree::HasNode(root,x,local_88);
            pTVar4 = local_c8;
            if (bVar7) {
              ::std::__cxx11::string::string
                        ((string *)local_118,(local_c8->config).HORIZONTAL,(allocator *)&local_a8);
              StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                 (pTVar4->config).node_render_width >> 1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
              y = local_c0;
              if ((RenderTreeNode *)local_e8._0_8_ != (RenderTreeNode *)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_);
              }
              if ((RenderTreeNode *)local_118._0_8_ != (RenderTreeNode *)(local_118 + 0x10)) {
                operator_delete((void *)local_118._0_8_);
              }
              if (bVar6) {
                pcVar16 = (local_c8->config).TMIDDLE;
                if (pcVar16 == (char *)0x0) {
                  ::std::ios::clear((int)local_f8._8_8_ +
                                    (int)*(undefined8 *)(*(long *)local_f8._8_8_ + -0x18));
                }
                else {
                  sVar9 = strlen(pcVar16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_f8._8_8_,pcVar16,sVar9);
                }
                pTVar4 = local_c8;
                ::std::__cxx11::string::string
                          ((string *)local_118,(local_c8->config).HORIZONTAL,(allocator *)&local_a8)
                ;
                StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                   (pTVar4->config).node_render_width >> 1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
              }
              else {
                pcVar16 = (local_c8->config).RTCORNER;
                if (pcVar16 == (char *)0x0) {
                  ::std::ios::clear((int)local_f8._8_8_ +
                                    (int)*(undefined8 *)(*(long *)local_f8._8_8_ + -0x18));
                }
                else {
                  sVar9 = strlen(pcVar16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_f8._8_8_,pcVar16,sVar9);
                }
                if (bVar5 == false) goto LAB_00ada22e;
                local_118._0_8_ = (RenderTreeNode *)(local_118 + 0x10);
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118," ","");
                StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                   (local_c8->config).node_render_width >> 1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
              }
            }
            else if (bVar6) {
              ::std::__cxx11::string::string
                        ((string *)local_118,(local_c8->config).HORIZONTAL,(allocator *)&local_a8);
              StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                 (pTVar4->config).node_render_width);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
            }
            else {
              if (bVar5 == false) goto LAB_00ada22e;
              local_118._0_8_ = (RenderTreeNode *)(local_118 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118," ","");
              StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                 (local_c8->config).node_render_width);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
            }
LAB_00ada20c:
            y = local_c0;
            if ((RenderTreeNode *)local_e8._0_8_ != (RenderTreeNode *)(local_e8 + 0x10)) {
              operator_delete((void *)local_e8._0_8_);
            }
            pRVar14 = (RenderTreeNode *)local_118._0_8_;
            if ((RenderTreeNode *)local_118._0_8_ != (RenderTreeNode *)(local_118 + 0x10))
            goto LAB_00ada229;
          }
          else {
            if (local_b8 < local_80) {
              if (bVar5 == false) goto LAB_00ada22e;
              local_118._0_8_ = (RenderTreeNode *)(local_118 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118," ","");
              StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                 (local_c8->config).node_render_width);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
              goto LAB_00ada20c;
            }
            bVar6 = RenderTree::HasNode(root,x,local_88);
            if (bVar6) {
              local_118._0_8_ = local_118 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118," ","");
              StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                 (local_c8->config).node_render_width >> 1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
              y = local_c0;
              if ((RenderTreeNode *)local_e8._0_8_ != (RenderTreeNode *)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_);
              }
              if ((RenderTreeNode *)local_118._0_8_ != (RenderTreeNode *)(local_118 + 0x10)) {
                operator_delete((void *)local_118._0_8_);
              }
              pcVar16 = (local_c8->config).VERTICAL;
              if (pcVar16 == (char *)0x0) {
                ::std::ios::clear((int)local_f8._8_8_ +
                                  (int)*(undefined8 *)(*(long *)local_f8._8_8_ + -0x18));
              }
              else {
                sVar9 = strlen(pcVar16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_f8._8_8_,pcVar16,sVar9);
              }
              if ((bVar5 != false) || (bVar5 = ShouldRenderWhitespace(root,x,y), bVar5)) {
                local_118._0_8_ = local_118 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118," ","");
                StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                   (local_c8->config).node_render_width >> 1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
                goto LAB_00ada20c;
              }
            }
            else if ((bVar5 != false) || (bVar5 = ShouldRenderWhitespace(root,x,y), bVar5)) {
              local_118._0_8_ = local_118 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118," ","");
              StringUtil::Repeat((string *)local_e8,(string *)local_118,
                                 (local_c8->config).node_render_width);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
              goto LAB_00ada20c;
            }
          }
        }
        else {
          pcVar16 = (local_c8->config).VERTICAL;
          if (pcVar16 == (char *)0x0) {
            ::std::ios::clear((int)local_f8._8_8_ +
                              (int)*(undefined8 *)(*(long *)local_f8._8_8_ + -0x18));
          }
          else {
            sVar9 = strlen(pcVar16);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_f8._8_8_,pcVar16,sVar9);
          }
          local_e8._0_8_ = local_e8 + 0x10;
          local_e8._8_8_ = 0;
          local_e8[0x10] = '\0';
          if (local_b8 == 0) {
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
LAB_00ad982b:
            ::std::__cxx11::string::_M_assign((string *)local_e8);
          }
          else {
            pvVar8 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                     ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                                   *)&local_78,x);
            if (local_b8 <=
                (ulong)((long)(pvVar8->
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar8->
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              pvVar8 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                       ::operator[]((vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                                     *)&local_78,x);
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](pvVar8,local_60);
              goto LAB_00ad982b;
            }
          }
          if ((local_58 == local_b0) && (local_e8._8_8_ == 0)) {
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
            uVar3 = local_f8._M_allocated_capacity;
            local_118._0_8_ = local_118 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,"__cardinality__","");
            iVar10 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(uVar3 + 0x38),(key_type *)local_118);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              ppVar15 = *(pointer *)(uVar3 + 0x28);
            }
            else {
              ppVar15 = (((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(uVar3 + 0x20))->map).
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        *(long *)((long)iVar10.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x28);
            }
            pRVar14 = (RenderTreeNode *)(local_118 + 0x10);
            if ((RenderTreeNode *)local_118._0_8_ != pRVar14) {
              operator_delete((void *)local_118._0_8_);
            }
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
            if (ppVar15 != *(pointer *)(local_f8._M_allocated_capacity + 0x28)) {
              pcVar1 = (ppVar15->second)._M_dataplus._M_p;
              local_118._0_8_ = pRVar14;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_118,pcVar1,pcVar1 + (ppVar15->second)._M_string_length);
              ::std::__cxx11::string::append(local_118);
              ::std::__cxx11::string::operator=((string *)local_e8,(string *)local_118);
              if ((RenderTreeNode *)local_118._0_8_ != pRVar14) {
                operator_delete((void *)local_118._0_8_);
              }
            }
          }
          if ((local_b8 == local_b0) && (local_e8._8_8_ == 0)) {
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
            uVar3 = local_f8._M_allocated_capacity;
            local_118._0_8_ = local_118 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"__timing__","");
            iVar10 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(uVar3 + 0x38),(key_type *)local_118);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              ppVar15 = *(pointer *)(uVar3 + 0x28);
            }
            else {
              ppVar15 = (((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(uVar3 + 0x20))->map).
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        *(long *)((long)iVar10.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x28);
            }
            if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
              operator_delete((void *)local_118._0_8_);
            }
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
            if (ppVar15 == *(pointer *)(local_f8._M_allocated_capacity + 0x28)) {
              optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                         &local_f8._M_allocated_capacity);
              uVar3 = local_f8._M_allocated_capacity;
              local_118._0_8_ = local_118 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_118,"__cardinality__","");
              iVar10 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)(uVar3 + 0x38),(key_type *)local_118);
              if (iVar10.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                ppVar15 = *(pointer *)(uVar3 + 0x28);
              }
              else {
                ppVar15 = (((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(uVar3 + 0x20))->map).
                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          .
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          *(long *)((long)iVar10.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                          ._M_cur + 0x28);
              }
              optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                         &local_f8._M_allocated_capacity);
              ppVar2 = *(pointer *)(local_f8._M_allocated_capacity + 0x28);
              if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                operator_delete((void *)local_118._0_8_);
              }
              if (ppVar15 == ppVar2) {
                optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                          ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                           &local_f8._M_allocated_capacity);
                uVar3 = local_f8._M_allocated_capacity;
                local_118._0_8_ = local_118 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_118,"__estimated_cardinality__","");
                iVar10 = ::std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)(uVar3 + 0x38),(key_type *)local_118);
                if (iVar10.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  ppVar15 = *(pointer *)(uVar3 + 0x28);
                }
                else {
                  ppVar15 = (((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(uVar3 + 0x20))->map).
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            *(long *)((long)iVar10.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                            ._M_cur + 0x28);
                }
                if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                  operator_delete((void *)local_118._0_8_);
                }
                optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                          ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                           &local_f8._M_allocated_capacity);
                if (ppVar15 != *(pointer *)(local_f8._M_allocated_capacity + 0x28)) {
                  ::std::operator+(&local_a8,"~",&ppVar15->second);
                  plVar11 = (long *)::std::__cxx11::string::append((char *)&local_a8);
                  goto LAB_00ad9a3e;
                }
              }
            }
            else {
              ::std::operator+(&local_a8,"(",&ppVar15->second);
              plVar11 = (long *)::std::__cxx11::string::append((char *)&local_a8);
LAB_00ad9a3e:
              plVar12 = plVar11 + 2;
              if ((long *)*plVar11 == plVar12) {
                local_118._16_8_ = *plVar12;
                local_118._24_8_ = plVar11[3];
                local_118._0_8_ = local_118 + 0x10;
              }
              else {
                local_118._16_8_ = *plVar12;
                local_118._0_8_ = (long *)*plVar11;
              }
              local_118._8_8_ = plVar11[1];
              *plVar11 = (long)plVar12;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_e8,(string *)local_118);
              if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                operator_delete((void *)local_118._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
            }
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
            uVar3 = local_f8._M_allocated_capacity;
            local_118._0_8_ = (RenderTreeNode *)(local_118 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,"__cardinality__","");
            iVar10 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(uVar3 + 0x38),(key_type *)local_118);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              ppVar15 = *(pointer *)(uVar3 + 0x28);
            }
            else {
              ppVar15 = (((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(uVar3 + 0x20))->map).
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        *(long *)((long)iVar10.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x28);
            }
            optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                      ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_f8._M_allocated_capacity
                      );
            ppVar2 = *(pointer *)(local_f8._M_allocated_capacity + 0x28);
            if ((RenderTreeNode *)local_118._0_8_ != (RenderTreeNode *)(local_118 + 0x10)) {
              operator_delete((void *)local_118._0_8_);
            }
            if (ppVar15 == ppVar2) {
              optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                         &local_f8._M_allocated_capacity);
              uVar3 = local_f8._M_allocated_capacity;
              local_118._0_8_ = local_118 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_118,"__estimated_cardinality__","");
              iVar10 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)(uVar3 + 0x38),(key_type *)local_118);
              if (iVar10.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                ppVar15 = *(pointer *)(uVar3 + 0x28);
              }
              else {
                ppVar15 = (((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(uVar3 + 0x20))->map).
                          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          .
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          *(long *)((long)iVar10.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                          ._M_cur + 0x28);
              }
              pRVar14 = (RenderTreeNode *)(local_118 + 0x10);
              if ((RenderTreeNode *)local_118._0_8_ != pRVar14) {
                operator_delete((void *)local_118._0_8_);
              }
              optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                         &local_f8._M_allocated_capacity);
              if (ppVar15 != *(pointer *)(local_f8._M_allocated_capacity + 0x28)) {
                ::std::operator+(&local_a8,"~",&ppVar15->second);
                plVar11 = (long *)::std::__cxx11::string::append((char *)&local_a8);
                pRVar13 = (RenderTreeNode *)(plVar11 + 2);
                if ((RenderTreeNode *)*plVar11 == pRVar13) {
                  local_118._16_8_ = (pRVar13->name)._M_dataplus._M_p;
                  local_118._24_8_ = plVar11[3];
                  local_118._0_8_ = pRVar14;
                }
                else {
                  local_118._16_8_ = (pRVar13->name)._M_dataplus._M_p;
                  local_118._0_8_ = (RenderTreeNode *)*plVar11;
                }
                local_118._8_8_ = plVar11[1];
                *plVar11 = (long)pRVar13;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_e8,(string *)local_118);
                if ((RenderTreeNode *)local_118._0_8_ != pRVar14) {
                  operator_delete((void *)local_118._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p);
                }
              }
            }
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_e8._0_8_,(pointer)(local_e8._0_8_ + local_e8._8_8_));
          AdjustTextForRendering
                    ((string *)local_118,&local_50,(local_c8->config).node_render_width - 2);
          ::std::__cxx11::string::operator=((string *)local_e8,(string *)local_118);
          if ((RenderTreeNode *)local_118._0_8_ != (RenderTreeNode *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
          y = local_c0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_f8._8_8_,(char *)local_e8._0_8_,local_e8._8_8_);
          if ((local_b8 == local_80) &&
             (optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
                        ((optional_ptr<duckdb::RenderTreeNode,_true> *)
                         &local_f8._M_allocated_capacity),
             0x10 < (ulong)((long)*(pointer *)(local_f8._M_allocated_capacity + 0x78) -
                           (long)(((vector<duckdb::RenderTreeNode::Coordinate,_true> *)
                                  (local_f8._M_allocated_capacity + 0x70))->
                                 super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                                 ).
                                 super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                                 ._M_impl.super__Vector_impl_data._M_start))) {
            pcVar16 = (local_c8->config).LMIDDLE;
          }
          else {
            pcVar16 = (local_c8->config).VERTICAL;
          }
          if (pcVar16 == (char *)0x0) {
            ::std::ios::clear((int)local_f8._8_8_ +
                              (int)*(undefined8 *)(*(long *)local_f8._8_8_ + -0x18));
          }
          else {
            sVar9 = strlen(pcVar16);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_f8._8_8_,pcVar16,sVar9);
          }
          pRVar14 = (RenderTreeNode *)local_e8._0_8_;
          if ((RenderTreeNode *)local_e8._0_8_ != (RenderTreeNode *)(local_e8 + 0x10)) {
LAB_00ada229:
            operator_delete(pRVar14);
          }
        }
LAB_00ada22e:
        x = x + 1;
      } while (x < root->width);
    }
    local_e8[0] = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f8._8_8_,local_e8,1);
    local_b8 = local_b8 + 1;
    if (local_b0 < local_b8) {
      ::std::
      vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
      ::~vector(&local_78);
      return;
    }
  } while( true );
}

Assistant:

void TextTreeRenderer::RenderBoxContent(RenderTree &root, std::ostream &ss, idx_t y) {
	// we first need to figure out how high our boxes are going to be
	vector<vector<string>> extra_info;
	idx_t extra_height = 0;
	extra_info.resize(root.width);
	for (idx_t x = 0; x < root.width; x++) {
		auto node = root.GetNode(x, y);
		if (node) {
			SplitUpExtraInfo(node->extra_text, extra_info[x], config.max_extra_lines);
			if (extra_info[x].size() > extra_height) {
				extra_height = extra_info[x].size();
			}
		}
	}
	idx_t halfway_point = (extra_height + 1) / 2;
	// now we render the actual node
	for (idx_t render_y = 0; render_y <= extra_height; render_y++) {
		for (idx_t x = 0; x < root.width; x++) {
			if (x * config.node_render_width >= config.maximum_render_width) {
				break;
			}
			bool has_adjacent_nodes = false;
			for (idx_t i = 0; x + i < root.width; i++) {
				has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
			}
			auto node = root.GetNode(x, y);
			if (!node) {
				if (render_y == halfway_point) {
					bool has_child_to_the_right = ShouldRenderWhitespace(root, x, y);
					if (root.HasNode(x, y + 1)) {
						// node right below this one
						ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2);
						if (has_child_to_the_right) {
							ss << config.TMIDDLE;
							// but we have another child to the right! keep rendering the line
							ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2);
						} else {
							ss << config.RTCORNER;
							if (has_adjacent_nodes) {
								// only a child below this one: fill the rest with spaces
								ss << StringUtil::Repeat(" ", config.node_render_width / 2);
							}
						}
					} else if (has_child_to_the_right) {
						// child to the right, but no child right below this one: render a full line
						ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width);
					} else {
						if (has_adjacent_nodes) {
							// empty spot: render spaces
							ss << StringUtil::Repeat(" ", config.node_render_width);
						}
					}
				} else if (render_y >= halfway_point) {
					if (root.HasNode(x, y + 1)) {
						// we have a node below this empty spot: render a vertical line
						ss << StringUtil::Repeat(" ", config.node_render_width / 2);
						ss << config.VERTICAL;
						if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
							ss << StringUtil::Repeat(" ", config.node_render_width / 2);
						}
					} else {
						if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
							// empty spot: render spaces
							ss << StringUtil::Repeat(" ", config.node_render_width);
						}
					}
				} else {
					if (has_adjacent_nodes) {
						// empty spot: render spaces
						ss << StringUtil::Repeat(" ", config.node_render_width);
					}
				}
			} else {
				ss << config.VERTICAL;
				// figure out what to render
				string render_text;
				if (render_y == 0) {
					render_text = node->name;
				} else {
					if (render_y <= extra_info[x].size()) {
						render_text = extra_info[x][render_y - 1];
					}
				}
				if (render_y + 1 == extra_height && render_text.empty()) {
					auto entry = node->extra_text.find(RenderTreeNode::CARDINALITY);
					if (entry != node->extra_text.end()) {
						render_text = entry->second + " Rows";
					}
				}
				if (render_y == extra_height && render_text.empty()) {
					auto timing_entry = node->extra_text.find(RenderTreeNode::TIMING);
					if (timing_entry != node->extra_text.end()) {
						render_text = "(" + timing_entry->second + ")";
					} else if (node->extra_text.find(RenderTreeNode::CARDINALITY) == node->extra_text.end()) {
						// we only render estimated cardinality if there is no real cardinality
						auto entry = node->extra_text.find(RenderTreeNode::ESTIMATED_CARDINALITY);
						if (entry != node->extra_text.end()) {
							render_text = "~" + entry->second + " Rows";
						}
					}
					if (node->extra_text.find(RenderTreeNode::CARDINALITY) == node->extra_text.end()) {
						// we only render estimated cardinality if there is no real cardinality
						auto entry = node->extra_text.find(RenderTreeNode::ESTIMATED_CARDINALITY);
						if (entry != node->extra_text.end()) {
							render_text = "~" + entry->second + " Rows";
						}
					}
				}
				render_text = AdjustTextForRendering(render_text, config.node_render_width - 2);
				ss << render_text;

				if (render_y == halfway_point && NodeHasMultipleChildren(*node)) {
					ss << config.LMIDDLE;
				} else {
					ss << config.VERTICAL;
				}
			}
		}
		ss << '\n';
	}
}